

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader-interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::anon_unknown_0::BinaryReaderInterp::OnExport
          (BinaryReaderInterp *this,Index index,ExternalKind kind,Index item_index,string_view name)

{
  ModuleDesc *pMVar1;
  string_view name_00;
  bool bVar2;
  reference pvVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  reference pvVar7;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_138;
  string local_130;
  value_type local_110;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_e0;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_d8;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_d0;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_c8;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_c0;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> local_b8;
  unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_> type;
  Location local_a0;
  Var local_80;
  Enum local_38;
  Index local_34;
  ExternalKind local_30;
  Index item_index_local;
  ExternalKind kind_local;
  Index index_local;
  BinaryReaderInterp *this_local;
  string_view name_local;
  
  name_local.data_ = (char *)name.size_;
  this_local = (BinaryReaderInterp *)name.data_;
  local_34 = item_index;
  local_30 = kind;
  item_index_local = index;
  _kind_local = this;
  Location::Location(&local_a0);
  Var::Var(&local_80,item_index,&local_a0);
  type._M_t.
  super___uniq_ptr_impl<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>.
  _M_t.
  super__Tuple_impl<0UL,_wabt::interp::ExternType_*,_std::default_delete<wabt::interp::ExternType>_>
  .super__Head_base<0UL,_wabt::interp::ExternType_*,_false>._M_head_impl =
       (__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
        )(__uniq_ptr_data<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>,_true,_true>
          )this_local;
  name_00.size_ = (size_type)name_local.data_;
  name_00.data_ = (char *)this_local;
  local_38 = (Enum)SharedValidator::OnExport
                             (&this->validator_,
                              (Location *)(anonymous_namespace)::BinaryReaderInterp::loc,kind,
                              &local_80,name_00);
  bVar2 = Failed((Result)local_38);
  Var::~Var(&local_80);
  if (bVar2) {
    Result::Result((Result *)((long)&name_local.size_ + 4),Error);
  }
  else {
    std::unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>>::
    unique_ptr<std::default_delete<wabt::interp::ExternType>,void>
              ((unique_ptr<wabt::interp::ExternType,std::default_delete<wabt::interp::ExternType>> *
               )&local_b8);
    switch(local_30) {
    case First:
      pvVar3 = std::vector<wabt::interp::FuncType,_std::allocator<wabt::interp::FuncType>_>::
               operator[](&this->func_types_,(ulong)local_34);
      (*(pvVar3->super_ExternType)._vptr_ExternType[2])(&local_c0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_b8,&local_c0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_c0);
      break;
    case Table:
      pvVar4 = std::vector<wabt::interp::TableType,_std::allocator<wabt::interp::TableType>_>::
               operator[](&this->table_types_,(ulong)local_34);
      (*(pvVar4->super_ExternType)._vptr_ExternType[2])(&local_c8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_b8,&local_c8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_c8);
      break;
    case Memory:
      pvVar5 = std::vector<wabt::interp::MemoryType,_std::allocator<wabt::interp::MemoryType>_>::
               operator[](&this->memory_types_,(ulong)local_34);
      (*(pvVar5->super_ExternType)._vptr_ExternType[2])(&local_d0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_b8,&local_d0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_d0);
      break;
    case Global:
      pvVar6 = std::vector<wabt::interp::GlobalType,_std::allocator<wabt::interp::GlobalType>_>::
               operator[](&this->global_types_,(ulong)local_34);
      (*(pvVar6->super_ExternType)._vptr_ExternType[2])(&local_d8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_b8,&local_d8);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_d8);
      break;
    case Event:
      pvVar7 = std::vector<wabt::interp::EventType,_std::allocator<wabt::interp::EventType>_>::
               operator[](&this->event_types_,(ulong)local_34);
      (*(pvVar7->super_ExternType)._vptr_ExternType[2])(&local_e0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      operator=(&local_b8,&local_e0);
      std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
      ~unique_ptr(&local_e0);
    }
    pMVar1 = this->module_;
    string_view::to_string_abi_cxx11_(&local_130,(string_view *)&this_local);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    unique_ptr(&local_138,&local_b8);
    ExportType::ExportType(&local_110.type,&local_130,&local_138);
    local_110.index = local_34;
    std::vector<wabt::interp::ExportDesc,_std::allocator<wabt::interp::ExportDesc>_>::push_back
              (&pMVar1->exports,&local_110);
    ExportDesc::~ExportDesc(&local_110);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr(&local_138);
    std::__cxx11::string::~string((string *)&local_130);
    Result::Result((Result *)((long)&name_local.size_ + 4),Ok);
    std::unique_ptr<wabt::interp::ExternType,_std::default_delete<wabt::interp::ExternType>_>::
    ~unique_ptr(&local_b8);
  }
  return (Result)name_local.size_._4_4_;
}

Assistant:

Result BinaryReaderInterp::OnExport(Index index,
                                    ExternalKind kind,
                                    Index item_index,
                                    string_view name) {
  CHECK_RESULT(validator_.OnExport(loc, kind, Var(item_index), name));

  std::unique_ptr<ExternType> type;
  switch (kind) {
    case ExternalKind::Func:   type = func_types_[item_index].Clone(); break;
    case ExternalKind::Table:  type = table_types_[item_index].Clone(); break;
    case ExternalKind::Memory: type = memory_types_[item_index].Clone(); break;
    case ExternalKind::Global: type = global_types_[item_index].Clone(); break;
    case ExternalKind::Event:  type = event_types_[item_index].Clone(); break;
  }
  module_.exports.push_back(
      ExportDesc{ExportType(name.to_string(), std::move(type)), item_index});
  return Result::Ok;
}